

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestEventListeners::TestEventListeners(TestEventListeners *this)

{
  TestEventRepeater *pTVar1;
  
  pTVar1 = (TestEventRepeater *)operator_new(0x28);
  (pTVar1->super_TestEventListener)._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_0015bed8;
  pTVar1->forwarding_enabled_ = true;
  (pTVar1->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar1->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar1->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->repeater_ = pTVar1;
  this->default_result_printer_ = (TestEventListener *)0x0;
  this->default_xml_generator_ = (TestEventListener *)0x0;
  return;
}

Assistant:

TestEventListeners::TestEventListeners()
    : repeater_(new internal::TestEventRepeater()),
      default_result_printer_(nullptr),
      default_xml_generator_(nullptr) {}